

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_tail_single.h
# Opt level: O0

uintptr_t __thiscall
density::detail::
LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
::page_overflow(LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
                *this,LfQueue_ProgressGuarantee i_progress_guarantee)

{
  uintptr_t *i_atomic;
  uintptr_t uVar1;
  progress_guarantee i_progress_guarantee_00;
  __pointer_type pLVar2;
  unsigned_long uVar3;
  __pointer_type local_40;
  ControlBlock *prev_block;
  ControlBlock *new_page;
  LfQueue_ProgressGuarantee i_progress_guarantee_local;
  LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
  *this_local;
  
  if (i_progress_guarantee == LfQueue_Throwing) {
    local_40 = (__pointer_type)
               basic_default_allocator<65536UL>::allocate_page
                         ((basic_default_allocator<65536UL> *)this);
  }
  else {
    i_progress_guarantee_00 = ToDenGuarantee(i_progress_guarantee);
    local_40 = (__pointer_type)
               basic_default_allocator<65536UL>::try_allocate_page
                         ((basic_default_allocator<65536UL> *)this,i_progress_guarantee_00);
  }
  if (local_40 == (__pointer_type)0x0) {
    this_local = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
                  *)0x0;
  }
  else {
    raw_atomic_store(&local_40->m_next,0,memory_order_seq_cst);
    if (this->m_tail == 0xffc0) {
      pLVar2 = std::atomic<density::detail::LfQueueControl_*>::load
                         (&this->m_initial_page,memory_order_seq_cst);
      if (pLVar2 != (__pointer_type)0x0) {
        density_tests::detail::assert_failed<>
                  ("m_initial_page.load() == nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_single.h"
                   ,0x151);
      }
      std::atomic<density::detail::LfQueueControl_*>::store
                (&this->m_initial_page,local_40,memory_order_seq_cst);
    }
    else {
      i_atomic = (uintptr_t *)this->m_tail;
      uVar1 = this->m_tail;
      uVar3 = uint_lower_align<unsigned_long>(this->m_tail,0x10000);
      if (uVar3 + 0xfff0 < uVar1 + 8) {
        density_tests::detail::assert_failed<>
                  ("m_tail + sizeof(ControlBlock) <= uint_lower_align(m_tail, ALLOCATOR_TYPE::page_alignment) + ALLOCATOR_TYPE::page_size"
                   ,
                   "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_single.h"
                   ,0x15c);
      }
      raw_atomic_store(i_atomic,(uintptr_t)((long)&local_40->m_next + 2),memory_order_seq_cst);
    }
    this->m_tail = (uintptr_t)local_40;
    this_local = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
                  *)this->m_tail;
  }
  return (uintptr_t)this_local;
}

Assistant:

DENSITY_NO_INLINE uintptr_t
                              page_overflow(LfQueue_ProgressGuarantee i_progress_guarantee)
            {
                auto const new_page = static_cast<ControlBlock *>(
                  i_progress_guarantee == LfQueue_Throwing
                    ? ALLOCATOR_TYPE::allocate_page()
                    : ALLOCATOR_TYPE::try_allocate_page(ToDenGuarantee(i_progress_guarantee)));
                DENSITY_ASSUME_ALIGNED(new_page, ALLOCATOR_TYPE::page_alignment);
                if (new_page == nullptr)
                {
                    // allocation failed
                    return 0;
                }

                // zero the first block of the new page
                raw_atomic_store(&new_page->m_next, uintptr_t(0), mem_relaxed);

                if (m_tail == s_invalid_control_block)
                {
                    /* virgin queue: this happens only once in the entire lifetime of the queue */
                    DENSITY_ASSERT_INTERNAL(m_initial_page.load() == nullptr);
                    m_initial_page.store(new_page, mem_release);
                }
                else
                {
                    /* Setup a dead block with the pointer to the new page. Unlike the multiple-producer cases,
                        this block is not allocated at a fixed position, and no padding dead blocks are necessary. */
                    auto const prev_block = reinterpret_cast<ControlBlock *>(m_tail);
                    DENSITY_ASSERT_INTERNAL(
                      m_tail + sizeof(ControlBlock) <=
                      uint_lower_align(m_tail, ALLOCATOR_TYPE::page_alignment) +
                        ALLOCATOR_TYPE::page_size);
                    raw_atomic_store(
                      &prev_block->m_next,
                      reinterpret_cast<uintptr_t>(new_page) + LfQueue_Dead,
                      mem_release);
                }

                // done
                m_tail = reinterpret_cast<uintptr_t>(new_page);
                return m_tail;
            }